

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::getSyncPointListString
          (CLIntercept *this,cl_uint numSyncPoints,cl_sync_point_khr *syncPointList,string *str)

{
  cl_uint i;
  ulong uVar1;
  ostringstream ss;
  string asStack_1c8 [32];
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,"( size = ");
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::operator<<((ostream *)local_1a8," )[ ");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::append((string *)str);
  std::__cxx11::string::~string(asStack_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  if (syncPointList != (cl_sync_point_khr *)0x0) {
    for (uVar1 = 0; numSyncPoints != uVar1; uVar1 = uVar1 + 1) {
      if (uVar1 != 0) {
        std::__cxx11::string::append((char *)str);
      }
      snprintf((char *)local_1a8,0x100,"%u",(ulong)syncPointList[uVar1]);
      std::__cxx11::string::append((char *)str);
    }
  }
  std::__cxx11::string::append((char *)str);
  return;
}

Assistant:

void CLIntercept::getSyncPointListString(
    cl_uint numSyncPoints,
    const cl_sync_point_khr* syncPointList,
    std::string& str ) const
{
    {
        std::ostringstream  ss;
        ss << "( size = ";
        ss << numSyncPoints;
        ss << " )[ ";
        str += ss.str();
    }
    if( syncPointList )
    {
        for( cl_uint i = 0; i < numSyncPoints; i++ )
        {
            if( i > 0 )
            {
                str += ", ";
            }
            {
                char    s[256];
                CLI_SPRINTF( s, 256, "%u", syncPointList[i] );
                str += s;
            }
        }
    }
    str += " ]";
}